

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

bool bssl::anon_unknown_0::FlushNewSessionTickets(SSL *client,SSL *server)

{
  bool bVar1;
  uint ret_code;
  uint uVar2;
  uint ret_code_00;
  byte unaff_BPL;
  char *__format;
  
  do {
    ret_code = SSL_write((SSL *)server,(void *)0x0,0);
    uVar2 = SSL_get_error((SSL *)server,ret_code);
    if (((int)ret_code < 1) && (uVar2 == 3 || ret_code == 0)) {
      ret_code_00 = SSL_read((SSL *)client,(void *)0x0,0);
      uVar2 = SSL_get_error((SSL *)client,ret_code_00);
      if ((ret_code_00 != 0xffffffff) || (uVar2 != 2)) {
        __format = "Unexpected client result: %d %d\n";
        ret_code = ret_code_00;
        goto LAB_00174210;
      }
      bVar1 = ret_code != 0;
      unaff_BPL = ret_code == 0 | unaff_BPL;
    }
    else {
      __format = "Unexpected server result: %d %d\n";
LAB_00174210:
      bVar1 = false;
      fprintf(_stderr,__format,(ulong)ret_code,(ulong)uVar2);
      unaff_BPL = 0;
    }
    if (!bVar1) {
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

static bool FlushNewSessionTickets(SSL *client, SSL *server) {
  // NewSessionTickets are deferred on the server to |SSL_write|, and clients do
  // not pick them up until |SSL_read|.
  for (;;) {
    int server_ret = SSL_write(server, nullptr, 0);
    int server_err = SSL_get_error(server, server_ret);
    // The server may either succeed (|server_ret| is zero) or block on write
    // (|server_ret| is -1 and |server_err| is |SSL_ERROR_WANT_WRITE|).
    if (server_ret > 0 ||
        (server_ret < 0 && server_err != SSL_ERROR_WANT_WRITE)) {
      fprintf(stderr, "Unexpected server result: %d %d\n", server_ret,
              server_err);
      return false;
    }

    int client_ret = SSL_read(client, nullptr, 0);
    int client_err = SSL_get_error(client, client_ret);
    // The client must always block on read.
    if (client_ret != -1 || client_err != SSL_ERROR_WANT_READ) {
      fprintf(stderr, "Unexpected client result: %d %d\n", client_ret,
              client_err);
      return false;
    }

    // The server flushed everything it had to write.
    if (server_ret == 0) {
      return true;
    }
  }
}